

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall
Fl_Text_Buffer::replace_selection_(Fl_Text_Buffer *this,Fl_Text_Selection *sel,char *text)

{
  Fl_Text_Selection oldSelection;
  Fl_Text_Selection local_20;
  
  local_20.mSelected = sel->mSelected;
  local_20._9_3_ = *(undefined3 *)&sel->field_0x9;
  local_20.mStart = sel->mStart;
  local_20.mEnd = sel->mEnd;
  if (sel->mSelected == true) {
    replace(this,sel->mStart,sel->mEnd,text);
    sel->mSelected = false;
    redisplay_selection(this,&local_20,sel);
  }
  return;
}

Assistant:

void Fl_Text_Buffer::replace_selection_(Fl_Text_Selection * sel,
					const char *text)
{
  Fl_Text_Selection oldSelection = *sel;
  
  /* If there's no selection, return */
  int start, end;
  if (!sel->position(&start, &end))
    return;
  
  /* Do the appropriate type of replace */
    replace(start, end, text);
  
  /* Unselect (happens automatically in BufReplace, but BufReplaceRect
   can't detect when the contents of a selection goes away) */
  sel->mSelected = 0;
  redisplay_selection(&oldSelection, sel);
}